

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_srl_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar4 [16];
  short sVar14;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar5 [16];
  
  auVar1 = *(undefined1 (*) [16])&(env->active_fpu).fpr[ws].fd;
  auVar4 = psllw((undefined1  [16])(env->active_fpu).fpr[wt],0xc);
  auVar15 = psraw(auVar4,0xf);
  auVar16._0_2_ = auVar1._0_2_ >> 8;
  auVar16._2_2_ = auVar1._2_2_ >> 8;
  auVar16._4_2_ = auVar1._4_2_ >> 8;
  auVar16._6_2_ = auVar1._6_2_ >> 8;
  auVar16._8_2_ = auVar1._8_2_ >> 8;
  auVar16._10_2_ = auVar1._10_2_ >> 8;
  auVar16._12_2_ = auVar1._12_2_ >> 8;
  auVar16._14_2_ = auVar1._14_2_ >> 8;
  auVar1 = auVar16 & auVar15 | ~auVar15 & auVar1;
  sVar3 = auVar4._0_2_;
  sVar8 = auVar4._2_2_;
  auVar5._2_2_ = sVar8 * 2;
  auVar5._0_2_ = sVar3 * 2;
  sVar9 = auVar4._4_2_;
  auVar5._4_2_ = sVar9 * 2;
  sVar10 = auVar4._6_2_;
  auVar5._6_2_ = sVar10 * 2;
  sVar11 = auVar4._8_2_;
  auVar5._8_2_ = sVar11 * 2;
  sVar12 = auVar4._10_2_;
  auVar5._10_2_ = sVar12 * 2;
  sVar13 = auVar4._12_2_;
  sVar14 = auVar4._14_2_;
  auVar5._12_2_ = sVar13 * 2;
  auVar5._14_2_ = sVar14 * 2;
  auVar16 = psraw(auVar5,0xf);
  auVar4._0_2_ = auVar1._0_2_ >> 4;
  auVar4._2_2_ = auVar1._2_2_ >> 4;
  auVar4._4_2_ = auVar1._4_2_ >> 4;
  auVar4._6_2_ = auVar1._6_2_ >> 4;
  auVar4._8_2_ = auVar1._8_2_ >> 4;
  auVar4._10_2_ = auVar1._10_2_ >> 4;
  auVar4._12_2_ = auVar1._12_2_ >> 4;
  auVar4._14_2_ = auVar1._14_2_ >> 4;
  auVar1 = auVar4 & auVar16 | ~auVar16 & auVar1;
  auVar6._2_2_ = sVar8 * 4;
  auVar6._0_2_ = sVar3 * 4;
  auVar6._4_2_ = sVar9 * 4;
  auVar6._6_2_ = sVar10 * 4;
  auVar6._8_2_ = sVar11 * 4;
  auVar6._10_2_ = sVar12 * 4;
  auVar6._12_2_ = sVar13 * 4;
  auVar6._14_2_ = sVar14 * 4;
  auVar16 = psraw(auVar6,0xf);
  auVar15._0_2_ = auVar1._0_2_ >> 2;
  auVar15._2_2_ = auVar1._2_2_ >> 2;
  auVar15._4_2_ = auVar1._4_2_ >> 2;
  auVar15._6_2_ = auVar1._6_2_ >> 2;
  auVar15._8_2_ = auVar1._8_2_ >> 2;
  auVar15._10_2_ = auVar1._10_2_ >> 2;
  auVar15._12_2_ = auVar1._12_2_ >> 2;
  auVar15._14_2_ = auVar1._14_2_ >> 2;
  auVar1 = auVar15 & auVar16 | ~auVar16 & auVar1;
  auVar7._2_2_ = sVar8 << 3;
  auVar7._0_2_ = sVar3 << 3;
  auVar7._4_2_ = sVar9 << 3;
  auVar7._6_2_ = sVar10 << 3;
  auVar7._8_2_ = sVar11 << 3;
  auVar7._10_2_ = sVar12 << 3;
  auVar7._12_2_ = sVar13 << 3;
  auVar7._14_2_ = sVar14 << 3;
  auVar16 = psraw(auVar7,0xf);
  auVar2._0_2_ = auVar1._0_2_ >> 1;
  auVar2._2_2_ = auVar1._2_2_ >> 1;
  auVar2._4_2_ = auVar1._4_2_ >> 1;
  auVar2._6_2_ = auVar1._6_2_ >> 1;
  auVar2._8_2_ = auVar1._8_2_ >> 1;
  auVar2._10_2_ = auVar1._10_2_ >> 1;
  auVar2._12_2_ = auVar1._12_2_ >> 1;
  auVar2._14_2_ = auVar1._14_2_ >> 1;
  (env->active_fpu).fpr[wd] = (fpr_t)(auVar2 & auVar16 | ~auVar16 & auVar1);
  return;
}

Assistant:

void helper_msa_srl_h(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_srl_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_srl_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_srl_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_srl_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_srl_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_srl_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_srl_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_srl_df(DF_HALF, pws->h[7],  pwt->h[7]);
}